

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

function<void_(const_QtPromisePrivate::PromiseError_&)> * __thiscall
QtPromisePrivate::PromiseCatcher<void,tst_future::fail_void()::$_0,MyException_const&>::
create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
          (function<void_(const_QtPromisePrivate::PromiseError_&)> *__return_storage_ptr__,
          PromiseCatcher<void,tst_future::fail_void()::__0,MyException_const&> *this,
          anon_class_8_1_6971b95b *handler,QPromiseResolve<void> *resolve,
          QPromiseReject<void> *reject)

{
  anon_class_24_3_a63a5800 local_40;
  QPromiseReject<void> *local_28;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  anon_class_8_1_6971b95b *handler_local;
  
  local_28 = (QPromiseReject<void> *)resolve;
  reject_local = (QPromiseReject<void> *)handler;
  resolve_local = (QPromiseResolve<void> *)this;
  handler_local = (anon_class_8_1_6971b95b *)__return_storage_ptr__;
  QtPromise::QPromiseResolve<void>::QPromiseResolve
            (&local_40.resolve,(QPromiseResolve<void> *)handler);
  QtPromise::QPromiseReject<void>::QPromiseReject(&local_40.reject,local_28);
  local_40.handler.result = (QString *)(resolve_local->m_resolver).m_d.d;
  std::function<void(QtPromisePrivate::PromiseError_const&)>::
  function<QtPromisePrivate::PromiseCatcher<void,tst_future::fail_void()::__0,MyException_const&>::create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_future::fail_void()::__0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda(QtPromisePrivate::PromiseError_const&)_1_,void>
            ((function<void(QtPromisePrivate::PromiseError_const&)> *)__return_storage_ptr__,
             &local_40);
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_future::fail_void()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const PromiseError&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const PromiseError& error) {
            try {
                error.rethrow();
            } catch (const TArg& argError) {
                PromiseDispatch<ResType>::call(resolve, reject, handler, argError);
            } catch (...) {
                reject(std::current_exception());
            }
        };
    }